

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

void setvalue(context *ctx,lua_State *L,int index,node *n)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined5 uVar5;
  long lVar2;
  lua_State *L_00;
  int iVar6;
  lua_Integer lVar7;
  void *pvVar8;
  char *pcVar9;
  lua_Number lVar10;
  int absidx;
  table *tbl;
  char *str;
  size_t sz;
  node *pnStack_28;
  int vt;
  node *n_local;
  lua_State *plStack_18;
  int index_local;
  lua_State *L_local;
  context *ctx_local;
  
  pnStack_28 = n;
  n_local._4_4_ = index;
  plStack_18 = L;
  L_local = (lua_State *)ctx;
  sz._4_4_ = lua_type(L,index);
  L_00 = plStack_18;
  switch(sz._4_4_) {
  case 0:
    pnStack_28->valuetype = '\0';
    break;
  case 1:
    iVar6 = lua_toboolean(plStack_18,n_local._4_4_);
    (pnStack_28->v).string = iVar6;
    pnStack_28->valuetype = '\x03';
    break;
  default:
    pcVar9 = lua_typename(plStack_18,sz._4_4_);
    luaL_error(L_00,"Unsupport value type %s",pcVar9);
    break;
  case 3:
    iVar6 = lua_isinteger(plStack_18,n_local._4_4_);
    if (iVar6 == 0) {
      lVar10 = lua_tonumberx(plStack_18,n_local._4_4_,(int *)0x0);
      (pnStack_28->v).n = lVar10;
      pnStack_28->valuetype = '\x01';
    }
    else {
      lVar7 = lua_tointegerx(plStack_18,n_local._4_4_,(int *)0x0);
      (pnStack_28->v).d = lVar7;
      pnStack_28->valuetype = '\x05';
    }
    break;
  case 4:
    str = (char *)0x0;
    pcVar9 = lua_tolstring(plStack_18,n_local._4_4_,(size_t *)&str);
    iVar6 = stringindex((context *)L_local,pcVar9,(size_t)str);
    (pnStack_28->v).string = iVar6;
    pnStack_28->valuetype = '\x02';
    break;
  case 5:
    uVar1 = L_local->tt;
    uVar3 = L_local->marked;
    uVar4 = L_local->status;
    uVar5 = *(undefined5 *)&L_local->field_0xb;
    pvVar8 = malloc(0x28);
    *(void **)&L_local->tt = pvVar8;
    lVar2._0_1_ = L_local->tt;
    lVar2._1_1_ = L_local->marked;
    lVar2._2_1_ = L_local->status;
    lVar2._3_5_ = *(undefined5 *)&L_local->field_0xb;
    if (lVar2 == 0) {
      L_local->tt = uVar1;
      L_local->marked = uVar3;
      L_local->status = uVar4;
      *(undefined5 *)&L_local->field_0xb = uVar5;
      luaL_error(plStack_18,"memory error");
    }
    memset(*(void **)&L_local->tt,0,0x28);
    iVar6 = lua_absindex(plStack_18,n_local._4_4_);
    lua_pushcclosure(plStack_18,convtable,0);
    lua_pushvalue(plStack_18,iVar6);
    lua_pushlightuserdata(plStack_18,L_local);
    lua_callk(plStack_18,2,0,0,(lua_KFunction)0x0);
    pnStack_28->v = *(value *)&L_local->tt;
    pnStack_28->valuetype = '\x04';
    L_local->tt = uVar1;
    L_local->marked = uVar3;
    L_local->status = uVar4;
    *(undefined5 *)&L_local->field_0xb = uVar5;
  }
  return;
}

Assistant:

static void
setvalue(struct context * ctx, lua_State *L, int index, struct node *n) {
	int vt = lua_type(L, index);
	switch(vt) {
	case LUA_TNIL:
		n->valuetype = VALUETYPE_NIL;
		break;
	case LUA_TNUMBER:
		if (lua_isinteger(L, index)) {
			n->v.d = lua_tointeger(L, index);
			n->valuetype = VALUETYPE_INTEGER;
		} else {
			n->v.n = lua_tonumber(L, index);
			n->valuetype = VALUETYPE_REAL;
		}
		break;
	case LUA_TSTRING: {
		size_t sz = 0;
		const char * str = lua_tolstring(L, index, &sz);
		n->v.string = stringindex(ctx, str, sz);
		n->valuetype = VALUETYPE_STRING;
		break;
	}
	case LUA_TBOOLEAN:
		n->v.boolean = lua_toboolean(L, index);
		n->valuetype = VALUETYPE_BOOLEAN;
		break;
	case LUA_TTABLE: {
		struct table *tbl = ctx->tbl;
		ctx->tbl = (struct table *)malloc(sizeof(struct table));
		if (ctx->tbl == NULL) {
			ctx->tbl = tbl;
			luaL_error(L, "memory error");
			// never get here
		}
		memset(ctx->tbl, 0, sizeof(struct table));
		int absidx = lua_absindex(L, index);

		lua_pushcfunction(L, convtable);
		lua_pushvalue(L, absidx);
		lua_pushlightuserdata(L, ctx);

		lua_call(L, 2, 0);

		n->v.tbl = ctx->tbl;
		n->valuetype = VALUETYPE_TABLE;

		ctx->tbl = tbl;

		break;
	}
	default:
		luaL_error(L, "Unsupport value type %s", lua_typename(L, vt));
		break;
	}
}